

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O3

void __thiscall ObjectFileDB::process_link_data(ObjectFileDB *this)

{
  key_type *pkVar1;
  pointer puVar2;
  pointer puVar3;
  iterator iVar4;
  int64_t iVar5;
  long lVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  key_type *__k;
  LinkedObjectFile *pLVar7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar8;
  byte bVar9;
  Stats combined_stats;
  Timer process_link_timer;
  vector<Label,_std::allocator<Label>_> local_1b8;
  Stats local_198;
  key_type *local_138;
  ObjectFileDB *local_130;
  key_type *local_128;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_120;
  Timer local_118;
  LinkedObjectFile local_108;
  
  bVar9 = 0;
  puts("- Processing Link Data...");
  local_118._startTime.tv_sec = 0;
  local_118._startTime.tv_nsec = 0;
  Timer::start(&local_118);
  local_198.data_bytes = 0;
  local_198.code_bytes = 0;
  local_198.function_count = 0;
  local_198.decoded_ops = 0;
  local_198.v3_link_bytes = 0;
  local_198.v3_symbol_count = 0;
  local_198.v3_symbol_link_offset = 0;
  local_198.v3_symbol_link_word = 0;
  local_198.v3_pointers = 0;
  local_198.v3_split_pointers = 0;
  local_198.v3_word_pointers = 0;
  local_198.v3_pointer_seeks = 0;
  local_198.total_v2_link_bytes = 0;
  local_198.total_v2_symbol_links = 0;
  local_198.total_v2_symbol_count = 0;
  local_198.v3_code_bytes = 0;
  local_198.total_code_bytes = 0;
  local_198.total_v2_code_bytes = 0;
  local_198.total_v2_pointers = 0;
  local_198.total_v2_pointer_seeks = 0;
  local_198.n_fp_reg_use = 0;
  local_198.n_fp_reg_use_resolved = 0;
  pkVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_130 = this;
  if ((this->obj_files_by_name)._M_h._M_element_count != (long)pkVar1 - (long)__k >> 5) {
LAB_00120104:
    __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                  ,0x3e,
                  "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:222:16)]"
                 );
  }
  if (__k != pkVar1) {
    do {
      local_138 = pkVar1;
      local_128 = __k;
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_130,__k);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
        goto LAB_00120104;
      }
      data = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
              ((long)iVar4.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                     ._M_cur + 0x28);
      local_120 = *(vector<unsigned_char,_std::allocator<unsigned_char>_> **)
                   ((long)iVar4.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                          ._M_cur + 0x30);
      if (data != local_120) {
        do {
          to_linked_object_file(&local_108,data,(string *)(data + 10));
          pLVar7 = &local_108;
          pvVar8 = data + 1;
          for (lVar6 = 0xb; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pvVar8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start = *(pointer *)&pLVar7->stats;
            pLVar7 = (LinkedObjectFile *)((long)pLVar7 + (ulong)bVar9 * -0x10 + 8);
            pvVar8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     ((long)pvVar8 + ((ulong)bVar9 * -2 + 1) * 8);
          }
          *(int *)&data[4].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage = local_108.segments;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)data[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          data[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_108.words_by_seg.
                        super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)data[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)data[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          data[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_108.words_by_seg.
                        super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          data[5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_108.words_by_seg.
                        super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_108.words_by_seg.
          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.words_by_seg.
          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.words_by_seg.
          super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ::~vector((vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                     *)&local_1b8);
          puVar2 = data[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_start;
          puVar3 = data[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
          data[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_108.offset_of_data_zone_by_seg.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
          data[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_108.offset_of_data_zone_by_seg.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          data[6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_108.offset_of_data_zone_by_seg.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          local_108.offset_of_data_zone_by_seg.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.offset_of_data_zone_by_seg.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.offset_of_data_zone_by_seg.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (puVar2 != (pointer)0x0) {
            operator_delete(puVar2,(long)puVar3 - (long)puVar2);
          }
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)data[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          data[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_108.functions_by_seg.
                        super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)data[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)data[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          data[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_108.functions_by_seg.
                        super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          data[7].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_108.functions_by_seg.
                        super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_108.functions_by_seg.
          super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.functions_by_seg.
          super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.functions_by_seg.
          super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
          ::~vector((vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
                     *)&local_1b8);
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)data[8].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          data[8].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_108.labels.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)data[8].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)data[8].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          data[8].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_108.labels.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                        super__Vector_impl_data._M_start;
          data[8].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_108.labels.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                        super__Vector_impl_data._M_finish;
          local_108.labels.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.labels.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.labels.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          std::vector<Label,_std::allocator<Label>_>::~vector(&local_1b8);
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)data[9].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          data[9].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)local_108.label_per_seg_by_offset.
                        super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)data[9].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
          local_1b8.super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)data[9].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
          data[9].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)local_108.label_per_seg_by_offset.
                        super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
          data[9].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)local_108.label_per_seg_by_offset.
                        super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_108.label_per_seg_by_offset.
          super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_108.label_per_seg_by_offset.
          super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_108.label_per_seg_by_offset.
          super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          std::
          vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
          ::~vector((vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
                     *)&local_1b8);
          std::
          vector<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
          ::~vector(&local_108.label_per_seg_by_offset);
          std::vector<Label,_std::allocator<Label>_>::~vector(&local_108.labels);
          std::
          vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
          ::~vector(&local_108.functions_by_seg);
          if (local_108.offset_of_data_zone_by_seg.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_108.offset_of_data_zone_by_seg.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_108.offset_of_data_zone_by_seg.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_108.offset_of_data_zone_by_seg.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
          ::~vector(&local_108.words_by_seg);
          LinkedObjectFile::Stats::add(&local_198,(Stats *)(data + 1));
          data = data + 0xc;
        } while (data != local_120);
      }
      __k = local_128 + 1;
      pkVar1 = local_138;
    } while (__k != local_138);
  }
  puts("Processed Link Data:");
  printf(" code %d bytes\n",local_198._0_8_ & 0xffffffff);
  printf(" v2 code %d bytes\n",(ulong)local_198._0_8_ >> 0x20);
  printf(" v2 link data %d bytes\n",local_198._16_8_ & 0xffffffff);
  printf(" v2 pointers %d\n",local_198._8_8_ & 0xffffffff);
  printf(" v2 pointer seeks %d\n",(ulong)local_198._8_8_ >> 0x20);
  printf(" v2 symbols %d\n",local_198._24_8_ & 0xffffffff);
  printf(" v2 symbol links %d\n",(ulong)local_198._16_8_ >> 0x20);
  printf(" v3 code %d bytes\n",(ulong)local_198._24_8_ >> 0x20);
  printf(" v3 link data %d bytes\n",local_198._48_8_ & 0xffffffff);
  printf(" v3 pointers %d\n",local_198._32_8_ & 0xffffffff);
  printf("   split %d\n",(ulong)local_198._32_8_ >> 0x20);
  printf("   word  %d\n",local_198._40_8_ & 0xffffffff);
  printf(" v3 pointer seeks %d\n",(ulong)local_198._40_8_ >> 0x20);
  printf(" v3 symbols %d\n",(ulong)local_198._48_8_ >> 0x20);
  printf(" v3 offset symbol links %d\n",local_198._56_8_ & 0xffffffff);
  printf(" v3 word symbol links %d\n",(ulong)local_198._56_8_ >> 0x20);
  iVar5 = Timer::getNs(&local_118);
  printf(" total %.3f ms\n",SUB84((double)iVar5 / 1000000.0,0));
  putchar(10);
  return;
}

Assistant:

void ObjectFileDB::process_link_data() {
  printf("- Processing Link Data...\n");
  Timer process_link_timer;

  LinkedObjectFile::Stats combined_stats;

  for_each_obj([&](ObjectFileData& obj) {
    obj.linked_data = to_linked_object_file(obj.data, obj.record.name);
    combined_stats.add(obj.linked_data.stats);
  });

  printf("Processed Link Data:\n");
  printf(" code %d bytes\n", combined_stats.total_code_bytes);
  printf(" v2 code %d bytes\n", combined_stats.total_v2_code_bytes);
  printf(" v2 link data %d bytes\n", combined_stats.total_v2_link_bytes);
  printf(" v2 pointers %d\n", combined_stats.total_v2_pointers);
  printf(" v2 pointer seeks %d\n", combined_stats.total_v2_pointer_seeks);
  printf(" v2 symbols %d\n", combined_stats.total_v2_symbol_count);
  printf(" v2 symbol links %d\n", combined_stats.total_v2_symbol_links);

  printf(" v3 code %d bytes\n", combined_stats.v3_code_bytes);
  printf(" v3 link data %d bytes\n", combined_stats.v3_link_bytes);
  printf(" v3 pointers %d\n", combined_stats.v3_pointers);
  printf("   split %d\n", combined_stats.v3_split_pointers);
  printf("   word  %d\n", combined_stats.v3_word_pointers);
  printf(" v3 pointer seeks %d\n", combined_stats.v3_pointer_seeks);
  printf(" v3 symbols %d\n", combined_stats.v3_symbol_count);
  printf(" v3 offset symbol links %d\n", combined_stats.v3_symbol_link_offset);
  printf(" v3 word symbol links %d\n", combined_stats.v3_symbol_link_word);

  printf(" total %.3f ms\n", process_link_timer.getMs());
  printf("\n");
}